

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O3

void cursespp::SchemaOverlay::Show
               (string *title,PrefsPtr *prefs,SchemaPtr *schema,function<void_(bool)> *callback)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  SchemaAdapter *this;
  ListOverlay *pLVar3;
  OverlayStack *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<SchemaAdapter> schemaAdapter;
  shared_ptr<cursespp::ListOverlay> dialog;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  ListOverlay *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  ILayoutPtr local_e8;
  IScrollAdapterPtr local_d8;
  SchemaPtr local_c8;
  PrefsPtr local_b8;
  _Any_data local_a8;
  code *local_98;
  undefined8 uStack_90;
  SchemaAdapter *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this = (SchemaAdapter *)operator_new(0x80);
  local_b8.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_b8.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
  if (local_b8.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_b8.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_b8.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_c8.super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (schema->super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_c8.super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (schema->super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_c8.super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c8.super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_c8.super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c8.super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_c8.super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  SchemaAdapter::SchemaAdapter(this,&local_b8,&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<SchemaAdapter*>(&local_100,this);
  if (local_c8.super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b8.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pLVar3 = (ListOverlay *)operator_new(0x360);
  ListOverlay::ListOverlay(pLVar3);
  std::__shared_ptr<cursespp::ListOverlay,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::ListOverlay,void>
            ((__shared_ptr<cursespp::ListOverlay,(__gnu_cxx::_Lock_policy)2> *)&local_f8,pLVar3);
  local_d8.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_100._M_pi;
  if (local_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_100._M_pi)->_M_use_count = (local_100._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_100._M_pi)->_M_use_count = (local_100._M_pi)->_M_use_count + 1;
    }
  }
  local_d8.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  pLVar3 = ListOverlay::SetAdapter(local_f8,&local_d8);
  pLVar3 = ListOverlay::SetTitle(pLVar3,title);
  pLVar3 = ListOverlay::SetWidthPercent(pLVar3,0x50);
  pLVar3 = ListOverlay::SetAutoDismiss(pLVar3,false);
  _Var1._M_pi = local_100._M_pi;
  if (local_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_100._M_pi)->_M_use_count = (local_100._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_100._M_pi)->_M_use_count = (local_100._M_pi)->_M_use_count + 1;
    }
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x10);
  *(SchemaAdapter **)local_58._M_unused._0_8_ = this;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 8) =
       _Var1._M_pi;
  pcStack_40 = std::
               _Function_handler<void_(cursespp::ListOverlay_*,_std::shared_ptr<cursespp::IScrollAdapter>,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:408:13)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(cursespp::ListOverlay_*,_std::shared_ptr<cursespp::IScrollAdapter>,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:408:13)>
             ::_M_manager;
  pLVar3 = ListOverlay::SetItemSelectedCallback(pLVar3,(ItemSelectedCallback *)&local_58);
  std::function<void_(bool)>::function((function<void_(bool)> *)&local_a8,callback);
  p_Stack_80 = local_100._M_pi;
  if (local_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_100._M_pi)->_M_use_count = (local_100._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_100._M_pi)->_M_use_count = (local_100._M_pi)->_M_use_count + 1;
    }
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_88 = this;
  local_78._M_unused._M_object = operator_new(0x30);
  p_Var2 = p_Stack_80;
  *(undefined8 *)local_78._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x18) = uStack_90;
  if (local_98 != (code *)0x0) {
    *(void **)local_78._M_unused._0_8_ = local_a8._M_unused._M_object;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_a8._8_8_;
    *(code **)((long)local_78._M_unused._0_8_ + 0x10) = local_98;
    local_98 = (code *)0x0;
    uStack_90 = 0;
  }
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(SchemaAdapter **)((long)local_78._M_unused._0_8_ + 0x20) = local_88;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78._M_unused._0_8_ + 0x28) = p_Var2
  ;
  local_88 = (SchemaAdapter *)0x0;
  pcStack_60 = std::
               _Function_handler<void_(cursespp::ListOverlay_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:411:31)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(cursespp::ListOverlay_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:411:31)>
             ::_M_manager;
  ListOverlay::SetDismissedCallback(pLVar3,(DismissedCallback *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_d8.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_00 = App::Overlays();
  local_e8.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_f8->super_OverlayBase).super_LayoutBase.super_ILayout;
  if (local_f8 == (ListOverlay *)0x0) {
    local_e8.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  local_e8.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_f0;
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_f0->_M_use_count = local_f0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_f0->_M_use_count = local_f0->_M_use_count + 1;
    }
  }
  OverlayStack::Push(this_00,&local_e8);
  if (local_e8.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  if (local_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100._M_pi);
  }
  return;
}

Assistant:

void SchemaOverlay::Show(
    const std::string& title,
    PrefsPtr prefs,
    SchemaPtr schema,
    std::function<void(bool)> callback)
{
    std::shared_ptr<SchemaAdapter> schemaAdapter(new SchemaAdapter(prefs, schema));
    std::shared_ptr<ListOverlay> dialog(new ListOverlay());

    dialog->SetAdapter(schemaAdapter)
        .SetTitle(title)
        .SetWidthPercent(80)
        .SetAutoDismiss(false)
        .SetItemSelectedCallback(
            [schemaAdapter](ListOverlay* overlay, IScrollAdapterPtr adapter, size_t index) {
                schemaAdapter->ShowOverlay(index);
            })
        .SetDismissedCallback([callback, schemaAdapter](ListOverlay* overlay) {
                if (callback) {
                    callback(schemaAdapter->Changed());
                }
            });

    cursespp::App::Overlays().Push(dialog);
}